

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmulNet.cpp
# Opt level: O3

EmulNet * __thiscall EmulNet::operator=(EmulNet *this,EmulNet *anotherEmulNet)

{
  int (*paiVar1) [3600];
  ulong uVar2;
  int (*paiVar3) [3600];
  long lVar4;
  long lVar5;
  
  this->par = anotherEmulNet->par;
  this->enInited = anotherEmulNet->enInited;
  paiVar1 = this->sent_msgs;
  paiVar3 = anotherEmulNet->recv_msgs;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      (*paiVar1)[lVar5] = paiVar3[-0x3e9][lVar5];
      paiVar1[0x3e9][lVar5] = (*paiVar3)[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0xe10);
    lVar4 = lVar4 + 1;
    paiVar3 = paiVar3 + 1;
    paiVar1 = paiVar1 + 1;
  } while (lVar4 != 1000);
  (this->emulnet).nextid = (anotherEmulNet->emulnet).nextid;
  uVar2._0_4_ = (anotherEmulNet->emulnet).currbuffsize;
  uVar2._4_4_ = (anotherEmulNet->emulnet).firsteltindex;
  (this->emulnet).currbuffsize = (undefined4)uVar2;
  (this->emulnet).firsteltindex = uVar2._4_4_;
  if (0 < (int)(undefined4)uVar2) {
    lVar4 = (uVar2 & 0xffffffff) + 0x36fc96;
    do {
      *(undefined8 *)((long)(this->sent_msgs + -1) + 0x3830 + lVar4 * 8) =
           *(undefined8 *)((long)(anotherEmulNet->sent_msgs + -1) + 0x3830 + lVar4 * 8);
      uVar2 = lVar4 - 0x36fc96;
      lVar4 = lVar4 + -1;
    } while (1 < uVar2);
  }
  return this;
}

Assistant:

EmulNet& EmulNet::operator =(EmulNet &anotherEmulNet) {
	int i, j;
	this->par = anotherEmulNet.par;
	this->enInited = anotherEmulNet.enInited;
	for ( i = 0; i < MAX_NODES; i++ ) {
		for ( j = 0; j < MAX_TIME; j++ ) {
			this->sent_msgs[i][j] = anotherEmulNet.sent_msgs[i][j];
			this->recv_msgs[i][j] = anotherEmulNet.recv_msgs[i][j];
		}
	}
	this->emulnet = anotherEmulNet.emulnet;
	return *this;
}